

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O1

void setfvarchecked(ident *id,float val)

{
  uint uVar1;
  char *pcVar2;
  char *fmt;
  
  uVar1 = id->flags;
  if ((uVar1 & 8) != 0) {
    pcVar2 = id->name;
    fmt = "variable %s is read-only";
LAB_00127a55:
    debugcode(fmt,pcVar2);
    return;
  }
  if ((uVar1 & 2) == 0 && (identflags & 0x10U) == 0) {
    if ((uVar1 & 0x10) == 0) goto LAB_00127a19;
    uVar1 = uVar1 & 0xffffffe5;
  }
  else {
    if ((uVar1 & 1) != 0) {
      pcVar2 = id->name;
      fmt = "cannot override persistent variable %s";
      goto LAB_00127a55;
    }
    if ((uVar1 & 0x10) != 0) goto LAB_00127a19;
    (id->field_5).argmask = *(uint *)(id->field_4).args;
    uVar1 = uVar1 | 0x10;
  }
  id->flags = uVar1;
LAB_00127a19:
  if ((val < (id->field_2).minvalf) ||
     ((id->field_3).maxvalf <= val && val != (id->field_3).maxvalf)) {
    val = clampfvar(id,val,(id->field_2).minvalf,(id->field_3).maxvalf);
  }
  *(float *)(id->field_4).args = val;
  if (id->fun != (identfun)0x0) {
    (*id->fun)();
    return;
  }
  return;
}

Assistant:

void setfvarchecked(ident *id, float val)
{
    if(id->flags&IDF_READONLY) debugcode("variable %s is read-only", id->name);
else
    {
        OVERRIDEVAR(return, id->overrideval.f = *id->storage.f, , );
        if(val < id->minvalf || val > id->maxvalf) val = clampfvar(id, val, id->minvalf, id->maxvalf);
        *id->storage.f = val;
        id->changed();
    }
}